

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

uc_err uc_ctl(uc_engine *uc,uc_control_type control,...)

{
  uint uVar1;
  gint gVar2;
  uc_err uVar3;
  uc_tb *in_RCX;
  uc_tb *in_RDX;
  uc_tb *local_1d8;
  int mode_1;
  int __init_ret_10;
  uint32_t *size_1;
  int __init_ret_9;
  uint32_t size;
  int mode;
  int __init_ret_8;
  int __init_ret_7;
  int __init_ret_6;
  uint64_t end;
  uint64_t addr_1;
  int __init_ret_5;
  uc_tb *tb;
  uint64_t addr;
  int __init_ret_4;
  int model_1;
  int *model;
  uc_tb *puStack_c8;
  int __init_ret_3;
  size_t i;
  size_t cnt_1;
  uint64_t *exits_1;
  uc_ctl_exit_request req;
  size_t cnt;
  uint64_t *exits;
  int __init_ret_2;
  size_t *exits_cnt;
  int __init_ret_1;
  int use_exits;
  int bits;
  uint32_t page_size_1;
  uint32_t *page_size;
  int __init_ret;
  uint64_t *arch_1;
  int *arch;
  int *pmode;
  va_list args;
  uc_err local_28;
  uc_err err;
  int type;
  int rw;
  uc_control_type control_local;
  uc_engine *uc_local;
  
  local_28 = UC_ERR_OK;
  uVar1 = control >> 0x1e;
  switch(control & 0xffff) {
  case UC_CTL_UC_MODE:
    if (uVar1 == 2) {
      *(uc_mode *)&local_1d8->pc = uc->mode;
    }
    else {
      local_28 = UC_ERR_ARG;
    }
    break;
  case UC_CTL_UC_PAGE_SIZE:
    if (uVar1 == 2) {
      if ((((uc->init_done ^ 0xffU) & 1) != 0) &&
         (uVar3 = uc_init_engine(uc), local_1d8 = in_RDX, uVar3 != UC_ERR_OK)) {
        return uVar3;
      }
      *(uint32_t *)&local_1d8->pc = uc->target_page_size;
    }
    else {
      use_exits = (uc_context_content)local_1d8;
      __init_ret_1 = 0;
      if ((uc->init_done & 1U) != 0) {
        return UC_ERR_ARG;
      }
      if (uc->arch != UC_ARCH_ARM) {
        return UC_ERR_ARG;
      }
      if (((uc_context_content)local_1d8 & (uc_context_content)local_1d8 - 1) != 0) {
        return UC_ERR_ARG;
      }
      for (; use_exits != 0; use_exits = (uint)use_exits >> 1) {
        __init_ret_1 = __init_ret_1 + 1;
      }
      uc->target_bits = __init_ret_1;
    }
    local_28 = UC_ERR_OK;
    break;
  case UC_CTL_UC_ARCH:
    if (uVar1 == 2) {
      *(uc_arch *)&local_1d8->pc = uc->arch;
    }
    else {
      local_28 = UC_ERR_ARG;
    }
    break;
  case UC_CTL_UC_TIMEOUT:
    if (uVar1 == 2) {
      local_1d8->pc = uc->timeout;
    }
    else {
      local_28 = UC_ERR_ARG;
    }
    break;
  case UC_CTL_UC_USE_EXITS:
    if (uVar1 == 1) {
      uc->use_exits = (uc_context_content)local_1d8;
    }
    else {
      local_28 = UC_ERR_ARG;
    }
    break;
  case UC_CTL_UC_EXITS_CNT:
    if ((((uc->init_done ^ 0xffU) & 1) != 0) && (uVar3 = uc_init_engine(uc), uVar3 != UC_ERR_OK)) {
      return uVar3;
    }
    if (uc->use_exits == 0) {
      local_28 = UC_ERR_ARG;
    }
    else if (uVar1 == 2) {
      gVar2 = g_tree_nnodes(uc->ctl_exits);
      in_RDX->pc = (long)gVar2;
    }
    else {
      local_28 = UC_ERR_ARG;
    }
    break;
  case UC_CTL_UC_EXITS:
    if ((((uc->init_done ^ 0xffU) & 1) != 0) && (uVar3 = uc_init_engine(uc), uVar3 != UC_ERR_OK)) {
      return uVar3;
    }
    if (uc->use_exits == 0) {
      local_28 = UC_ERR_ARG;
    }
    else if (uVar1 == 2) {
      req.len = (size_t)in_RCX;
      gVar2 = g_tree_nnodes(uc->ctl_exits);
      if (in_RCX < (uc_tb *)(long)gVar2) {
        local_28 = UC_ERR_ARG;
      }
      else {
        req.array = (uint64_t *)0x0;
        exits_1 = &in_RDX->pc;
        g_tree_foreach(uc->ctl_exits,uc_read_exit_iter,&exits_1);
      }
    }
    else if (uVar1 == 1) {
      g_tree_remove_all(uc->ctl_exits);
      for (puStack_c8 = (uc_tb *)0x0; puStack_c8 < in_RCX;
          puStack_c8 = (uc_tb *)((long)&puStack_c8->pc + 1)) {
        uc_add_exit(uc,(&in_RDX->pc)[(long)puStack_c8]);
      }
    }
    else {
      local_28 = UC_ERR_ARG;
    }
    break;
  case UC_CTL_CPU_MODEL:
    if (uVar1 == 2) {
      if ((((uc->init_done ^ 0xffU) & 1) != 0) &&
         (uVar3 = uc_init_engine(uc), local_1d8 = in_RDX, uVar3 != UC_ERR_OK)) {
        return uVar3;
      }
      *(int *)&local_1d8->pc = uc->cpu_model;
    }
    else {
      if (((int)(uc_context_content)local_1d8 < 0) || ((uc->init_done & 1U) != 0)) {
        return UC_ERR_ARG;
      }
      if (uc->arch == UC_ARCH_X86) {
        if (0x25 < (int)(uc_context_content)local_1d8) {
          return UC_ERR_ARG;
        }
      }
      else if (uc->arch == UC_ARCH_ARM) {
        if (0x21 < (int)(uc_context_content)local_1d8) {
          return UC_ERR_ARG;
        }
        if ((((uc->mode & UC_MODE_BIG_ENDIAN) != UC_MODE_ARM) &&
            ((int)(uc_context_content)local_1d8 < 0x12)) &&
           (0xd < (int)(uc_context_content)local_1d8)) {
          return UC_ERR_ARG;
        }
      }
      else if (uc->arch == UC_ARCH_ARM64) {
        if (3 < (int)(uc_context_content)local_1d8) {
          return UC_ERR_ARG;
        }
      }
      else if (uc->arch == UC_ARCH_MIPS) {
        if (((uc->mode & UC_MODE_32) != UC_MODE_ARM) && (0xf < (int)(uc_context_content)local_1d8))
        {
          return UC_ERR_ARG;
        }
        if (((uc->mode & UC_MODE_64) != UC_MODE_ARM) && (0xc < (int)(uc_context_content)local_1d8))
        {
          return UC_ERR_ARG;
        }
      }
      else if (uc->arch == UC_ARCH_PPC) {
        if (((uc->mode & UC_MODE_32) != UC_MODE_ARM) && (0x121 < (int)(uc_context_content)local_1d8)
           ) {
          return UC_ERR_ARG;
        }
        if (((uc->mode & UC_MODE_64) != UC_MODE_ARM) && (0x12 < (int)(uc_context_content)local_1d8))
        {
          return UC_ERR_ARG;
        }
      }
      else if (uc->arch == UC_ARCH_RISCV) {
        if (((uc->mode & UC_MODE_32) != UC_MODE_ARM) && (3 < (int)(uc_context_content)local_1d8)) {
          return UC_ERR_ARG;
        }
        if (((uc->mode & UC_MODE_64) != UC_MODE_ARM) && (3 < (int)(uc_context_content)local_1d8)) {
          return UC_ERR_ARG;
        }
      }
      else if (uc->arch == UC_ARCH_S390X) {
        if (0x25 < (int)(uc_context_content)local_1d8) {
          return UC_ERR_ARG;
        }
      }
      else if (uc->arch == UC_ARCH_SPARC) {
        if (((uc->mode & UC_MODE_32) != UC_MODE_ARM) && (0xc < (int)(uc_context_content)local_1d8))
        {
          return UC_ERR_ARG;
        }
        if (((uc->mode & UC_MODE_64) != UC_MODE_ARM) && (0x10 < (int)(uc_context_content)local_1d8))
        {
          return UC_ERR_ARG;
        }
      }
      else {
        if (uc->arch != UC_ARCH_M68K) {
          return UC_ERR_ARG;
        }
        if (8 < (int)(uc_context_content)local_1d8) {
          return UC_ERR_ARG;
        }
      }
      uc->cpu_model = (uc_context_content)local_1d8;
    }
    local_28 = UC_ERR_OK;
    break;
  case UC_CTL_TB_REQUEST_CACHE:
    if ((((uc->init_done ^ 0xffU) & 1) != 0) && (uVar3 = uc_init_engine(uc), uVar3 != UC_ERR_OK)) {
      return uVar3;
    }
    if (uVar1 == 3) {
      local_28 = (*uc->uc_gen_tb)(uc,(uint64_t)in_RDX,in_RCX);
    }
    else {
      local_28 = UC_ERR_ARG;
    }
    break;
  case UC_CTL_TB_REMOVE_CACHE:
    if ((((uc->init_done ^ 0xffU) & 1) != 0) && (uVar3 = uc_init_engine(uc), uVar3 != UC_ERR_OK)) {
      return uVar3;
    }
    if (uVar1 == 1) {
      if (in_RDX < in_RCX) {
        (*uc->uc_invalidate_tb)(uc,(uint64_t)in_RDX,(long)in_RCX - (long)in_RDX);
      }
      else {
        local_28 = UC_ERR_ARG;
      }
    }
    else {
      local_28 = UC_ERR_ARG;
    }
    break;
  case UC_CTL_TB_FLUSH:
    if ((((uc->init_done ^ 0xffU) & 1) != 0) && (uVar3 = uc_init_engine(uc), uVar3 != UC_ERR_OK)) {
      return uVar3;
    }
    if (uVar1 == 1) {
      (*uc->tb_flush)(uc);
    }
    else {
      local_28 = UC_ERR_ARG;
    }
    break;
  case UC_CTL_TLB_FLUSH:
    if ((((uc->init_done ^ 0xffU) & 1) != 0) && (uVar3 = uc_init_engine(uc), uVar3 != UC_ERR_OK)) {
      return uVar3;
    }
    if (uVar1 == 1) {
      (*uc->tcg_flush_tlb)(uc);
    }
    else {
      local_28 = UC_ERR_ARG;
    }
    break;
  case UC_CTL_TLB_TYPE:
    if ((((uc->init_done ^ 0xffU) & 1) != 0) && (uVar3 = uc_init_engine(uc), uVar3 != UC_ERR_OK)) {
      return uVar3;
    }
    if (uVar1 == 1) {
      local_1d8._0_4_ = (uc_context_content)in_RDX;
      local_28 = (*uc->set_tlb)(uc,(uc_context_content)local_1d8);
    }
    else {
      local_28 = UC_ERR_ARG;
    }
    break;
  case UC_CTL_TCG_BUFFER_SIZE:
    if (uVar1 == 1) {
      uc->tcg_buffer_size = (uc_context_content)local_1d8;
    }
    else {
      if ((((uc->init_done ^ 0xffU) & 1) != 0) &&
         (uVar3 = uc_init_engine(uc), local_1d8 = in_RDX, uVar3 != UC_ERR_OK)) {
        return uVar3;
      }
      *(uint32_t *)&local_1d8->pc = uc->tcg_buffer_size;
    }
    break;
  case UC_CTL_CONTEXT_MODE:
    if ((((uc->init_done ^ 0xffU) & 1) != 0) &&
       (uVar3 = uc_init_engine(uc), local_1d8 = in_RDX, uVar3 != UC_ERR_OK)) {
      return uVar3;
    }
    if (uVar1 == 1) {
      uc->context_content = (uc_context_content)local_1d8;
      local_28 = UC_ERR_OK;
    }
    else {
      local_28 = UC_ERR_ARG;
    }
    break;
  default:
    local_28 = UC_ERR_ARG;
  }
  return local_28;
}

Assistant:

UNICORN_EXPORT
uc_err uc_ctl(uc_engine *uc, uc_control_type control, ...)
{
    int rw, type;
    uc_err err = UC_ERR_OK;
    va_list args;

    // MSVC Would do signed shift on signed integers.
    rw = (uint32_t)control >> 30;
    type = (control & ((1 << 16) - 1));
    va_start(args, control);

    switch (type) {
    case UC_CTL_UC_MODE: {
        if (rw == UC_CTL_IO_READ) {
            int *pmode = va_arg(args, int *);
            *pmode = uc->mode;
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_UC_ARCH: {
        if (rw == UC_CTL_IO_READ) {
            int *arch = va_arg(args, int *);
            *arch = uc->arch;
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_UC_TIMEOUT: {
        if (rw == UC_CTL_IO_READ) {
            uint64_t *arch = va_arg(args, uint64_t *);
            *arch = uc->timeout;
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_UC_PAGE_SIZE: {
        if (rw == UC_CTL_IO_READ) {

            UC_INIT(uc);

            uint32_t *page_size = va_arg(args, uint32_t *);
            *page_size = uc->target_page_size;
        } else {
            uint32_t page_size = va_arg(args, uint32_t);
            int bits = 0;

            if (uc->init_done) {
                err = UC_ERR_ARG;
                break;
            }

            if (uc->arch != UC_ARCH_ARM) {
                err = UC_ERR_ARG;
                break;
            }

            if ((page_size & (page_size - 1))) {
                err = UC_ERR_ARG;
                break;
            }

            while (page_size) {
                bits++;
                page_size >>= 1;
            }

            uc->target_bits = bits;

            err = UC_ERR_OK;
        }
        break;
    }

    case UC_CTL_UC_USE_EXITS: {
        if (rw == UC_CTL_IO_WRITE) {
            int use_exits = va_arg(args, int);
            uc->use_exits = use_exits;
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_UC_EXITS_CNT: {

        UC_INIT(uc);

        if (!uc->use_exits) {
            err = UC_ERR_ARG;
        } else if (rw == UC_CTL_IO_READ) {
            size_t *exits_cnt = va_arg(args, size_t *);
            *exits_cnt = g_tree_nnodes(uc->ctl_exits);
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_UC_EXITS: {

        UC_INIT(uc);

        if (!uc->use_exits) {
            err = UC_ERR_ARG;
        } else if (rw == UC_CTL_IO_READ) {
            uint64_t *exits = va_arg(args, uint64_t *);
            size_t cnt = va_arg(args, size_t);
            if (cnt < g_tree_nnodes(uc->ctl_exits)) {
                err = UC_ERR_ARG;
            } else {
                uc_ctl_exit_request req;
                req.array = exits;
                req.len = 0;

                g_tree_foreach(uc->ctl_exits, uc_read_exit_iter, (void *)&req);
            }
        } else if (rw == UC_CTL_IO_WRITE) {
            uint64_t *exits = va_arg(args, uint64_t *);
            size_t cnt = va_arg(args, size_t);

            g_tree_remove_all(uc->ctl_exits);

            for (size_t i = 0; i < cnt; i++) {
                uc_add_exit(uc, exits[i]);
            }
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_CPU_MODEL: {
        if (rw == UC_CTL_IO_READ) {

            UC_INIT(uc);

            int *model = va_arg(args, int *);
            *model = uc->cpu_model;
        } else {
            int model = va_arg(args, int);

            if (model < 0 || uc->init_done) {
                err = UC_ERR_ARG;
                break;
            }

            if (uc->arch == UC_ARCH_X86) {
                if (model >= UC_CPU_X86_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_ARM) {
                if (model >= UC_CPU_ARM_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }

                if (uc->mode & UC_MODE_BIG_ENDIAN) {
                    // These cpu models don't support big endian code access.
                    if (model <= UC_CPU_ARM_CORTEX_A15 &&
                        model >= UC_CPU_ARM_CORTEX_A7) {
                        err = UC_ERR_ARG;
                        break;
                    }
                }
            } else if (uc->arch == UC_ARCH_ARM64) {
                if (model >= UC_CPU_ARM64_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_MIPS) {
                if (uc->mode & UC_MODE_32 && model >= UC_CPU_MIPS32_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }

                if (uc->mode & UC_MODE_64 && model >= UC_CPU_MIPS64_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_PPC) {
                // UC_MODE_PPC32 == UC_MODE_32
                if (uc->mode & UC_MODE_32 && model >= UC_CPU_PPC32_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }

                if (uc->mode & UC_MODE_64 && model >= UC_CPU_PPC64_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_RISCV) {
                if (uc->mode & UC_MODE_32 && model >= UC_CPU_RISCV32_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }

                if (uc->mode & UC_MODE_64 && model >= UC_CPU_RISCV64_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_S390X) {
                if (model >= UC_CPU_S390X_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_SPARC) {
                if (uc->mode & UC_MODE_32 && model >= UC_CPU_SPARC32_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
                if (uc->mode & UC_MODE_64 && model >= UC_CPU_SPARC64_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_M68K) {
                if (model >= UC_CPU_M68K_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else {
                err = UC_ERR_ARG;
                break;
            }

            uc->cpu_model = model;

            err = UC_ERR_OK;
        }
        break;
    }

    case UC_CTL_TB_REQUEST_CACHE: {

        UC_INIT(uc);

        if (rw == UC_CTL_IO_READ_WRITE) {
            uint64_t addr = va_arg(args, uint64_t);
            uc_tb *tb = va_arg(args, uc_tb *);
            err = uc->uc_gen_tb(uc, addr, tb);
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_TB_REMOVE_CACHE: {

        UC_INIT(uc);

        if (rw == UC_CTL_IO_WRITE) {
            uint64_t addr = va_arg(args, uint64_t);
            uint64_t end = va_arg(args, uint64_t);
            if (end <= addr) {
                err = UC_ERR_ARG;
            } else {
                uc->uc_invalidate_tb(uc, addr, end - addr);
            }
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_TB_FLUSH:

        UC_INIT(uc);

        if (rw == UC_CTL_IO_WRITE) {
            uc->tb_flush(uc);
        } else {
            err = UC_ERR_ARG;
        }
        break;

    case UC_CTL_TLB_FLUSH:

        UC_INIT(uc);

        if (rw == UC_CTL_IO_WRITE) {
            uc->tcg_flush_tlb(uc);
        } else {
            err = UC_ERR_ARG;
        }
        break;

    case UC_CTL_TLB_TYPE: {

        UC_INIT(uc);

        if (rw == UC_CTL_IO_WRITE) {
            int mode = va_arg(args, int);
            err = uc->set_tlb(uc, mode);
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_TCG_BUFFER_SIZE: {
        if (rw == UC_CTL_IO_WRITE) {
            uint32_t size = va_arg(args, uint32_t);
            uc->tcg_buffer_size = size;
        } else {

            UC_INIT(uc);

            uint32_t *size = va_arg(args, uint32_t *);
            *size = uc->tcg_buffer_size;
        }
        break;
    }

    case UC_CTL_CONTEXT_MODE:

        UC_INIT(uc);

        if (rw == UC_CTL_IO_WRITE) {
            int mode = va_arg(args, int);
            uc->context_content = mode;
            err = UC_ERR_OK;
        } else {
            err = UC_ERR_ARG;
        }
        break;

    default:
        err = UC_ERR_ARG;
        break;
    }

    va_end(args);

    return err;
}